

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O3

TestCaseGroup * vkt::SpirVAssembly::createModuleTests(TestContext *testCtx)

{
  pointer pcVar1;
  ulong uVar2;
  deUint8 inputValue;
  ShaderPermutation SVar3;
  undefined3 extraout_var;
  long *plVar4;
  size_type *psVar5;
  long lVar6;
  InstanceContext *this;
  ulong uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  _Alloc_hider _Var9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_868;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_858;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_848;
  undefined1 local_838 [32];
  _Base_ptr local_818;
  size_t local_810;
  string local_808;
  undefined1 local_7e8 [32];
  _Base_ptr local_7c8;
  size_t local_7c0;
  string local_7b8;
  string local_798;
  string local_778;
  TestCaseGroup *local_758;
  string name;
  string local_720;
  ShaderElement *local_700;
  ShaderElement *local_6f8;
  ulong local_6f0;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  long *local_688 [2];
  long local_678 [2];
  long *local_668 [2];
  long local_658 [2];
  long *local_648 [2];
  long local_638 [2];
  RGBA defaultColors [4];
  int local_5e0;
  RGBA invertedColors [4];
  ShaderElement local_5a8;
  ShaderElement local_560;
  ShaderElement local_518;
  ShaderElement local_4d0;
  ShaderElement local_488;
  InstanceContext local_438;
  InstanceContext local_358;
  InstanceContext local_278;
  ShaderElement local_198;
  ShaderElement local_150;
  ShaderElement local_108;
  ShaderElement local_c0;
  ShaderElement local_78;
  
  defaultColors[0].m_value = 0;
  defaultColors[1].m_value = 0;
  defaultColors[2].m_value = 0;
  defaultColors[3].m_value = 0;
  invertedColors[0].m_value = 0;
  invertedColors[1].m_value = 0;
  invertedColors[2].m_value = 0;
  invertedColors[3].m_value = 0;
  local_758 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(local_758,testCtx,"module","Multiple entry points into shaders")
  ;
  local_5a8.moduleName._M_dataplus._M_p = (pointer)&local_5a8.moduleName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"module","");
  local_7e8._0_8_ = local_7e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7e8,"main","");
  ShaderElement::ShaderElement
            (&local_198,&local_5a8.moduleName,(string *)local_7e8,VK_SHADER_STAGE_VERTEX_BIT);
  pcVar1 = local_838 + 0x10;
  local_838._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_838,"module","");
  _Var9._M_p = (pointer)&local_868;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffff788,"main","");
  ShaderElement::ShaderElement
            (&local_150,(string *)local_838,(string *)&stack0xfffffffffffff788,
             VK_SHADER_STAGE_GEOMETRY_BIT);
  name._M_dataplus._M_p = (pointer)&name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&name,"module","");
  local_858._M_allocated_capacity = (size_type)&local_848;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"main","");
  ShaderElement::ShaderElement
            (&local_108,&name,(string *)&local_858,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT);
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_808,"module","");
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b8,"main","");
  ShaderElement::ShaderElement
            (&local_c0,&local_808,&local_7b8,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT);
  local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_778,"module","");
  local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_798,"main","");
  ShaderElement::ShaderElement(&local_78,&local_778,&local_798,VK_SHADER_STAGE_FRAGMENT_BIT);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p != &local_798.field_2) {
    operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_778._M_dataplus._M_p != &local_778.field_2) {
    operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_858._M_allocated_capacity != &local_848) {
    operator_delete((void *)local_858._M_allocated_capacity,local_848._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var9._M_p != &local_868) {
    operator_delete(_Var9._M_p,local_868._M_allocated_capacity + 1);
  }
  if ((pointer)local_838._0_8_ != pcVar1) {
    operator_delete((void *)local_838._0_8_,local_838._16_8_ + 1);
  }
  if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
    operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8.moduleName._M_dataplus._M_p != &local_5a8.moduleName.field_2) {
    operator_delete(local_5a8.moduleName._M_dataplus._M_p,
                    local_5a8.moduleName.field_2._M_allocated_capacity + 1);
  }
  getDefaultColors(&defaultColors);
  getInvertedDefaultColors(&invertedColors);
  local_7e8._0_8_ = local_7e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7e8,"same_module","");
  local_838._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_838,"");
  local_5a8.moduleName.field_2._8_8_ = &local_5a8.moduleName._M_string_length;
  local_5a8.moduleName._M_dataplus._M_p = (pointer)0x0;
  local_5a8.moduleName._M_string_length = 0;
  local_5a8.moduleName.field_2._M_allocated_capacity = 0;
  local_5a8.entryName._M_string_length = 0;
  local_5a8.entryName._M_dataplus._M_p = (pointer)local_5a8.moduleName.field_2._8_8_;
  createInstanceContext<5ul>
            (&local_278,(SpirVAssembly *)&local_198,(ShaderElement_0_ *)&local_5a8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x0);
  addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
            (local_758,(string *)local_7e8,(string *)local_838,createCombinedModule,
             runAndVerifyDefaultPipeline,&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.failMessageTemplate._M_dataplus._M_p != &local_278.failMessageTemplate.field_2) {
    operator_delete(local_278.failMessageTemplate._M_dataplus._M_p,
                    local_278.failMessageTemplate.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_278.specConstants._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_278.testCodeFragments._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
               *)&local_278);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_5a8);
  if ((pointer)local_838._0_8_ != pcVar1) {
    operator_delete((void *)local_838._0_8_,local_838._16_8_ + 1);
  }
  if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
    operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
  }
  local_6f8 = &local_560;
  local_700 = &local_518;
  inputValue = '\0';
  do {
    SVar3 = getShaderPermutation(inputValue);
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_798,"vert","");
    local_6f0 = CONCAT35(extraout_var,SVar3);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_798);
    local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_778.field_2._M_allocated_capacity = *psVar5;
      local_778.field_2._8_8_ = plVar4[3];
    }
    else {
      local_778.field_2._M_allocated_capacity = *psVar5;
      local_778._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_778._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_778);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_7b8.field_2._M_allocated_capacity = *psVar5;
      local_7b8.field_2._8_8_ = plVar4[3];
      local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
    }
    else {
      local_7b8.field_2._M_allocated_capacity = *psVar5;
      local_7b8._M_dataplus._M_p = (pointer)*plVar4;
    }
    uVar7 = local_6f0 & 0xffffffffff;
    local_7b8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_7b8);
    local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_808.field_2._M_allocated_capacity = *psVar5;
      local_808.field_2._8_8_ = plVar4[3];
    }
    else {
      local_808.field_2._M_allocated_capacity = *psVar5;
      local_808._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_808._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_808);
    local_858._M_allocated_capacity = (size_type)&local_848;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 == paVar8) {
      local_848._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_848._8_8_ = plVar4[3];
    }
    else {
      local_848._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_858._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar4;
    }
    local_858._8_8_ = plVar4[1];
    *plVar4 = (long)paVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append(local_858._M_local_buf);
    _Var9._M_p = (pointer)&local_868;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 == paVar8) {
      local_868._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_868._8_8_ = plVar4[3];
    }
    else {
      local_868._M_allocated_capacity = paVar8->_M_allocated_capacity;
      _Var9._M_p = (pointer)*plVar4;
    }
    *plVar4 = (long)paVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append(&stack0xfffffffffffff788);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      local_838._16_8_ = *psVar5;
      local_838._24_8_ = plVar4[3];
      local_838._0_8_ = local_838 + 0x10;
    }
    else {
      local_838._16_8_ = *psVar5;
      local_838._0_8_ = (size_type *)*plVar4;
    }
    local_838._8_8_ = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append(local_838);
    local_7e8._0_8_ = local_7e8 + 0x10;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      local_7e8._16_8_ = *psVar5;
      local_7e8._24_8_ = plVar4[3];
    }
    else {
      local_7e8._16_8_ = *psVar5;
      local_7e8._0_8_ = (size_type *)*plVar4;
    }
    local_7e8._8_8_ = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append(local_7e8);
    local_5a8.moduleName._M_dataplus._M_p = (pointer)&local_5a8.moduleName.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_5a8.moduleName.field_2._M_allocated_capacity = *psVar5;
      local_5a8.moduleName.field_2._8_8_ = plVar4[3];
    }
    else {
      local_5a8.moduleName.field_2._M_allocated_capacity = *psVar5;
      local_5a8.moduleName._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_5a8.moduleName._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_5a8);
    name._M_dataplus._M_p = (pointer)&name.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      name.field_2._M_allocated_capacity = *psVar5;
      name.field_2._8_8_ = plVar4[3];
    }
    else {
      name.field_2._M_allocated_capacity = *psVar5;
      name._M_dataplus._M_p = (pointer)*plVar4;
    }
    name._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8.moduleName._M_dataplus._M_p != &local_5a8.moduleName.field_2) {
      operator_delete(local_5a8.moduleName._M_dataplus._M_p,
                      local_5a8.moduleName.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
      operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
    }
    if ((undefined1 *)local_838._0_8_ != local_838 + 0x10) {
      operator_delete((void *)local_838._0_8_,local_838._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var9._M_p != &local_868) {
      operator_delete(_Var9._M_p,local_868._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_858._M_allocated_capacity != &local_848) {
      operator_delete((void *)local_858._M_allocated_capacity,local_848._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_808._M_dataplus._M_p != &local_808.field_2) {
      operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
      operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_778._M_dataplus._M_p != &local_778.field_2) {
      operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
    }
    local_7e8._0_8_ = local_7e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7e8,"vert","");
    _Var9._M_p = (pointer)&local_868;
    std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffff788,"vert","");
    plVar4 = (long *)std::__cxx11::string::append(&stack0xfffffffffffff788);
    local_838._0_8_ = local_838 + 0x10;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      local_838._16_8_ = *psVar5;
      local_838._24_8_ = plVar4[3];
    }
    else {
      local_838._16_8_ = *psVar5;
      local_838._0_8_ = (size_type *)*plVar4;
    }
    local_838._8_8_ = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    ShaderElement::ShaderElement
              (&local_5a8,(string *)local_7e8,(string *)local_838,VK_SHADER_STAGE_VERTEX_BIT);
    local_858._M_allocated_capacity = (size_type)&local_848;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"geom","");
    local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b8,"geom","");
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_7b8);
    local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_808.field_2._M_allocated_capacity = *psVar5;
      local_808.field_2._8_8_ = plVar4[3];
    }
    else {
      local_808.field_2._M_allocated_capacity = *psVar5;
      local_808._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_808._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    ShaderElement::ShaderElement
              (&local_560,(string *)&local_858,&local_808,VK_SHADER_STAGE_GEOMETRY_BIT);
    local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_778,"tessc","");
    local_648[0] = local_638;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_648,"tessc","");
    plVar4 = (long *)std::__cxx11::string::append((char *)local_648);
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_798.field_2._M_allocated_capacity = *psVar5;
      local_798.field_2._8_8_ = plVar4[3];
    }
    else {
      local_798.field_2._M_allocated_capacity = *psVar5;
      local_798._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_798._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    ShaderElement::ShaderElement
              (&local_518,&local_778,&local_798,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT);
    local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"tesse","");
    local_668[0] = local_658;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_668,"tesse","");
    plVar4 = (long *)std::__cxx11::string::append((char *)local_668);
    local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_720.field_2._M_allocated_capacity = *psVar5;
      local_720.field_2._8_8_ = plVar4[3];
    }
    else {
      local_720.field_2._M_allocated_capacity = *psVar5;
      local_720._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_720._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    ShaderElement::ShaderElement
              (&local_4d0,&local_6a8,&local_720,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT);
    local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"frag","");
    local_688[0] = local_678;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"frag","");
    plVar4 = (long *)std::__cxx11::string::append((char *)local_688);
    uVar2 = local_6f0;
    local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_6e8.field_2._M_allocated_capacity = *psVar5;
      local_6e8.field_2._8_8_ = plVar4[3];
    }
    else {
      local_6e8.field_2._M_allocated_capacity = *psVar5;
      local_6e8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_6e8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    ShaderElement::ShaderElement(&local_488,&local_6c8,&local_6e8,VK_SHADER_STAGE_FRAGMENT_BIT);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
      operator_delete(local_6e8._M_dataplus._M_p,local_6e8.field_2._M_allocated_capacity + 1);
    }
    if (local_688[0] != local_678) {
      operator_delete(local_688[0],local_678[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
      operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_720._M_dataplus._M_p != &local_720.field_2) {
      operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
    }
    if (local_668[0] != local_658) {
      operator_delete(local_668[0],local_658[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
      operator_delete(local_6a8._M_dataplus._M_p,local_6a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
    }
    if (local_648[0] != local_638) {
      operator_delete(local_648[0],local_638[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_778._M_dataplus._M_p != &local_778.field_2) {
      operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_808._M_dataplus._M_p != &local_808.field_2) {
      operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
      operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_858._M_allocated_capacity != &local_848) {
      operator_delete((void *)local_858._M_allocated_capacity,local_848._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_838._0_8_ != local_838 + 0x10) {
      operator_delete((void *)local_838._0_8_,local_838._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var9._M_p != &local_868) {
      operator_delete(_Var9._M_p,local_868._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
      operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
    }
    local_5e0 = (int)(uVar7 >> 0x10);
    local_858._M_allocated_capacity = (size_type)&local_848;
    if (((int)(uVar7 >> 0x18) + local_5e0 + (int)(uVar7 >> 8) + (int)uVar2 + (int)(uVar7 >> 0x20) &
        1U) == 0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"");
      local_838._0_8_ = (pointer)0x0;
      local_838._8_8_ = 0;
      local_838._16_8_ = 0;
      local_838._24_8_ = local_838 + 8;
      local_810 = 0;
      local_7e8._16_8_ = 0;
      local_7e8._0_8_ = (pointer)0x0;
      local_7e8._8_8_ = 0;
      local_7e8._24_8_ = local_7e8 + 8;
      local_7c0 = 0;
      local_868._M_allocated_capacity = local_868._M_allocated_capacity & 0xffffffffffffff00;
      _Var9._M_p = (pointer)&local_868;
      local_818 = (_Base_ptr)local_838._24_8_;
      local_7c8 = (_Base_ptr)local_7e8._24_8_;
      createInstanceContext<5ul>
                (&local_358,(SpirVAssembly *)&local_5a8,(ShaderElement_0_ *)defaultColors,
                 &defaultColors,(RGBA (*) [4])local_838,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_7e8,(StageToSpecConstantMap *)&DAT_00000001,
                 (qpTestResult)&stack0xfffffffffffff788,(string *)&local_868);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var9._M_p != &local_868) {
        operator_delete(_Var9._M_p,local_868._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *)local_7e8);
      addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
                (local_758,&name,(string *)&local_858,createMultipleEntries,
                 runAndVerifyDefaultPipeline,&local_358);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358.failMessageTemplate._M_dataplus._M_p !=
          &local_358.failMessageTemplate.field_2) {
        operator_delete(local_358.failMessageTemplate._M_dataplus._M_p,
                        local_358.failMessageTemplate.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(&local_358.specConstants._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_358.testCodeFragments._M_t);
      this = &local_358;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"");
      local_838._0_8_ = (pointer)0x0;
      local_838._8_8_ = 0;
      local_838._16_8_ = 0;
      local_838._24_8_ = local_838 + 8;
      local_810 = 0;
      local_7e8._16_8_ = 0;
      local_7e8._0_8_ = (pointer)0x0;
      local_7e8._8_8_ = 0;
      local_7e8._24_8_ = local_7e8 + 8;
      local_7c0 = 0;
      local_868._M_allocated_capacity = local_868._M_allocated_capacity & 0xffffffffffffff00;
      _Var9._M_p = (pointer)&local_868;
      local_818 = (_Base_ptr)local_838._24_8_;
      local_7c8 = (_Base_ptr)local_7e8._24_8_;
      createInstanceContext<5ul>
                (&local_438,(SpirVAssembly *)&local_5a8,(ShaderElement_0_ *)defaultColors,
                 &invertedColors,(RGBA (*) [4])local_838,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_7e8,(StageToSpecConstantMap *)&DAT_00000001,
                 (qpTestResult)&stack0xfffffffffffff788,(string *)&local_868);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var9._M_p != &local_868) {
        operator_delete(_Var9._M_p,local_868._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *)local_7e8);
      addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
                (local_758,&name,(string *)&local_858,createMultipleEntries,
                 runAndVerifyDefaultPipeline,&local_438);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438.failMessageTemplate._M_dataplus._M_p !=
          &local_438.failMessageTemplate.field_2) {
        operator_delete(local_438.failMessageTemplate._M_dataplus._M_p,
                        local_438.failMessageTemplate.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(&local_438.specConstants._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_438.testCodeFragments._M_t);
      this = &local_438;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
                 *)this);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_838);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_858._M_allocated_capacity != &local_848) {
      operator_delete((void *)local_858._M_allocated_capacity,local_848._M_allocated_capacity + 1);
    }
    lVar6 = -0x168;
    paVar8 = &local_488.entryName.field_2;
    do {
      if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar8->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar8->_M_allocated_capacity)[-2],
                        paVar8->_M_allocated_capacity + 1);
      }
      if (&paVar8->_M_allocated_capacity + -4 != (size_type *)(&paVar8->_M_allocated_capacity)[-6])
      {
        operator_delete((size_type *)(&paVar8->_M_allocated_capacity)[-6],
                        (&paVar8->_M_allocated_capacity)[-4] + 1);
      }
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(&paVar8->_M_allocated_capacity + -9);
      lVar6 = lVar6 + 0x48;
    } while (lVar6 != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    inputValue = inputValue + '\x01';
  } while (inputValue != ' ');
  lVar6 = -0x168;
  paVar8 = &local_78.entryName.field_2;
  do {
    if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar8->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar8->_M_allocated_capacity)[-2],paVar8->_M_allocated_capacity + 1
                     );
    }
    if (&paVar8->_M_allocated_capacity + -4 != (size_type *)(&paVar8->_M_allocated_capacity)[-6]) {
      operator_delete((size_type *)(&paVar8->_M_allocated_capacity)[-6],
                      (&paVar8->_M_allocated_capacity)[-4] + 1);
    }
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar8->_M_allocated_capacity + -9);
    lVar6 = lVar6 + 0x48;
  } while (lVar6 != 0);
  return local_758;
}

Assistant:

tcu::TestCaseGroup* createModuleTests(tcu::TestContext& testCtx)
{
	RGBA								defaultColors[4];
	RGBA								invertedColors[4];
	de::MovePtr<tcu::TestCaseGroup>		moduleTests			(new tcu::TestCaseGroup(testCtx, "module", "Multiple entry points into shaders"));

	const ShaderElement					combinedPipeline[]	=
	{
		ShaderElement("module", "main", VK_SHADER_STAGE_VERTEX_BIT),
		ShaderElement("module", "main", VK_SHADER_STAGE_GEOMETRY_BIT),
		ShaderElement("module", "main", VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT),
		ShaderElement("module", "main", VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT),
		ShaderElement("module", "main", VK_SHADER_STAGE_FRAGMENT_BIT)
	};

	getDefaultColors(defaultColors);
	getInvertedDefaultColors(invertedColors);
	addFunctionCaseWithPrograms<InstanceContext>(moduleTests.get(), "same_module", "", createCombinedModule, runAndVerifyDefaultPipeline, createInstanceContext(combinedPipeline, map<string, string>()));

	const char* numbers[] =
	{
		"1", "2"
	};

	for (deInt8 idx = 0; idx < 32; ++idx)
	{
		ShaderPermutation			permutation		= getShaderPermutation(idx);
		string						name			= string("vert") + numbers[permutation.vertexPermutation] + "_geom" + numbers[permutation.geometryPermutation] + "_tessc" + numbers[permutation.tesscPermutation] + "_tesse" + numbers[permutation.tessePermutation] + "_frag" + numbers[permutation.fragmentPermutation];
		const ShaderElement			pipeline[]		=
		{
			ShaderElement("vert",	string("vert") +	numbers[permutation.vertexPermutation],		VK_SHADER_STAGE_VERTEX_BIT),
			ShaderElement("geom",	string("geom") +	numbers[permutation.geometryPermutation],	VK_SHADER_STAGE_GEOMETRY_BIT),
			ShaderElement("tessc",	string("tessc") +	numbers[permutation.tesscPermutation],		VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT),
			ShaderElement("tesse",	string("tesse") +	numbers[permutation.tessePermutation],		VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT),
			ShaderElement("frag",	string("frag") +	numbers[permutation.fragmentPermutation],	VK_SHADER_STAGE_FRAGMENT_BIT)
		};

		// If there are an even number of swaps, then it should be no-op.
		// If there are an odd number, the color should be flipped.
		if ((permutation.vertexPermutation + permutation.geometryPermutation + permutation.tesscPermutation + permutation.tessePermutation + permutation.fragmentPermutation) % 2 == 0)
		{
			addFunctionCaseWithPrograms<InstanceContext>(moduleTests.get(), name, "", createMultipleEntries, runAndVerifyDefaultPipeline, createInstanceContext(pipeline, defaultColors, defaultColors, map<string, string>()));
		}
		else
		{
			addFunctionCaseWithPrograms<InstanceContext>(moduleTests.get(), name, "", createMultipleEntries, runAndVerifyDefaultPipeline, createInstanceContext(pipeline, defaultColors, invertedColors, map<string, string>()));
		}
	}
	return moduleTests.release();
}